

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O2

REF_STATUS
ref_facelift_eval_at
          (REF_FACELIFT ref_facelift,REF_INT type,REF_INT id,REF_DBL *params,REF_DBL *xyz,
          REF_DBL *dxyz_dtuv)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  REF_CELL ref_cell;
  double dVar7;
  REF_INT cell;
  REF_NODE local_1d0;
  REF_DBL clip [3];
  REF_DBL bary [3];
  REF_DBL displacement [3];
  REF_INT nodes [27];
  
  uVar1 = ref_egads_eval_at(ref_facelift->grid->geom,type,id,params,xyz,dxyz_dtuv);
  if (uVar1 == 0) {
    if (type == 0) {
      return 0;
    }
    if (ref_facelift->displacement != (REF_DBL *)0x0) {
      uVar1 = ref_facelift_displacement_at(ref_facelift,type,id,params,displacement);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x2e7,"ref_facelift_eval_at",(ulong)uVar1,"facelift displacement");
        return uVar1;
      }
      *xyz = *xyz + displacement[0];
      xyz[1] = xyz[1] + displacement[1];
      xyz[2] = displacement[2] + xyz[2];
      return 0;
    }
    local_1d0 = ref_facelift->grid->node;
    uVar1 = ref_facelift_enclosing(ref_facelift,type,id,params,&cell,bary);
    if (uVar1 != 0) {
      uVar4 = (ulong)uVar1;
      pcVar6 = "enclose";
      uVar3 = 0x2cb;
      goto LAB_001a049c;
    }
    if (cell == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x2d1,"ref_facelift_eval_at","no enclosing found");
      if (type == 2) {
        printf("faceid %d parms %.15e %.15e\n",*params,params[1],(ulong)(uint)id);
        return 1;
      }
      if (type != 1) {
        return 1;
      }
      printf("edgeid %d parms %.15e\n",*params,(ulong)(uint)id);
      return 1;
    }
    if (type == 2) {
      ref_cell = ref_facelift->tri_cell;
      uVar1 = ref_node_clip_bary3(bary,clip);
      if (uVar1 != 0) {
        uVar4 = (ulong)uVar1;
        pcVar6 = "clip face bary";
        uVar3 = 0x2d8;
        goto LAB_001a049c;
      }
    }
    else {
      if (type != 1) goto LAB_001a06cd;
      ref_cell = ref_facelift->edg_cell;
      uVar1 = ref_node_clip_bary2(bary,clip);
      if (uVar1 != 0) {
        uVar4 = (ulong)uVar1;
        pcVar6 = "clip edge bary";
        uVar3 = 0x2d4;
        goto LAB_001a049c;
      }
    }
    if (ref_cell == (REF_CELL)0x0) {
LAB_001a06cd:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x2da,"ref_facelift_eval_at","ref_cell NULL, protect dereference");
      return 2;
    }
    uVar1 = ref_cell_shape(ref_cell->type,clip,displacement);
    if (uVar1 == 0) {
      uVar1 = ref_cell_nodes(ref_cell,cell,nodes);
      if (uVar1 == 0) {
        uVar2 = 0;
        uVar4 = (ulong)(uint)ref_cell->node_per;
        if (ref_cell->node_per < 1) {
          uVar4 = uVar2;
        }
        for (; uVar2 != 3; uVar2 = uVar2 + 1) {
          xyz[uVar2] = 0.0;
          dVar7 = 0.0;
          for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
            dVar7 = dVar7 + displacement[uVar5] *
                            local_1d0->real[(long)nodes[uVar5] * 0xf + (long)(int)uVar2];
            xyz[uVar2] = dVar7;
          }
        }
        return 0;
      }
      uVar4 = (ulong)uVar1;
      pcVar6 = "nodes";
      uVar3 = 0x2dc;
    }
    else {
      uVar4 = (ulong)uVar1;
      pcVar6 = "shape";
      uVar3 = 0x2db;
    }
  }
  else {
    uVar4 = (ulong)uVar1;
    pcVar6 = "egads eval";
    uVar3 = 0x2c2;
  }
LAB_001a049c:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar3,
         "ref_facelift_eval_at",uVar4,pcVar6);
  return (REF_STATUS)uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_eval_at(REF_FACELIFT ref_facelift, REF_INT type,
                                        REF_INT id, REF_DBL *params,
                                        REF_DBL *xyz, REF_DBL *dxyz_dtuv) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_DBL displacement[3];
  RSS(ref_egads_eval_at(ref_geom, type, id, params, xyz, dxyz_dtuv),
      "egads eval");
  if (REF_GEOM_NODE == type) return REF_SUCCESS;
  if (ref_facelift_direct(ref_facelift)) {
    REF_NODE ref_node = ref_grid_node(ref_facelift_grid(ref_facelift));
    REF_INT i, cell_node, cell, nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL bary[3], clip[3];
    REF_DBL shape[REF_CELL_MAX_NODE_PER];
    REF_CELL ref_cell = NULL;
    RSS(ref_facelift_enclosing(ref_facelift, type, id, params, &cell, bary),
        "enclose");
    RUB(REF_EMPTY, cell, "no enclosing found", {
      if (REF_GEOM_EDGE == type)
        printf("edgeid %d parms %.15e\n", id, params[0]);
      if (REF_GEOM_FACE == type)
        printf("faceid %d parms %.15e %.15e\n", id, params[0], params[1]);
    });
    if (REF_GEOM_EDGE == type) {
      ref_cell = ref_facelift_edg(ref_facelift);
      RSS(ref_node_clip_bary2(bary, clip), "clip edge bary");
    }
    if (REF_GEOM_FACE == type) {
      ref_cell = ref_facelift_tri(ref_facelift);
      RSS(ref_node_clip_bary3(bary, clip), "clip face bary");
    }
    RNS(ref_cell, "ref_cell NULL, protect dereference");
    RSS(ref_cell_shape(ref_cell_type(ref_cell), clip, shape), "shape");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    for (i = 0; i < 3; i++) {
      xyz[i] = 0.0;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        xyz[i] +=
            shape[cell_node] * ref_node_xyz(ref_node, i, nodes[cell_node]);
      }
    }
  } else {
    RSS(ref_facelift_displacement_at(ref_facelift, type, id, params,
                                     displacement),
        "facelift displacement");
    xyz[0] += displacement[0];
    xyz[1] += displacement[1];
    xyz[2] += displacement[2];
  }
  return REF_SUCCESS;
}